

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon_maps.c
# Opt level: O3

void rotate_dungeons(dw_rom *rom)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  dw_map_index town;
  dw_map_meta *pdVar4;
  dw_map_meta *pdVar5;
  dw_warp *pdVar6;
  dw_chest *pdVar7;
  dwr_spike_table *pdVar8;
  uint64_t uVar9;
  ulong uVar10;
  undefined1 *__ptr;
  undefined1 *puVar11;
  uint uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  uint8_t *puVar18;
  ulong uVar19;
  byte bVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  
  if ((rom->flags[10] & 0xc) != 0) {
    puts("Rotating and mirroring dungeons...");
    lVar27 = 0;
    do {
      town = (&DAT_00176d70)[lVar27];
      pdVar4 = (rom->map).meta;
      uVar21 = pdVar4[town].width;
      uVar23 = pdVar4[town].height;
      uVar9 = mt_rand(0,0xf);
      if ((uVar9 & 0xff) != 0 || lVar27 != 6) {
        bVar16 = uVar21 + 1;
        bVar24 = uVar23 + 1;
        uVar10 = (ulong)bVar16;
        uVar25 = (uint)bVar24 * (uint)bVar16;
        uVar26 = (ulong)uVar25;
        __ptr = (undefined1 *)calloc(uVar26,1);
        uVar17 = (ulong)(uint)bVar24;
        if (bVar24 != 0) {
          uVar14 = 0;
          puVar13 = __ptr;
          do {
            if (bVar16 != 0) {
              pdVar5 = (rom->map).meta;
              bVar2 = pdVar5[town].width;
              uVar3 = *(ushort *)pdVar5[town].pointer;
              puVar18 = rom->content;
              uVar19 = 0;
              do {
                uVar1 = ((ulong)bVar2 + 1) * uVar14 + uVar19;
                bVar20 = puVar18[(uVar1 >> 1) + (ulong)(uVar3 & 0x7fff)] >> 4;
                if ((uVar1 & 1) != 0) {
                  bVar20 = puVar18[(uVar1 >> 1) + (ulong)(uVar3 & 0x7fff)];
                }
                puVar13[uVar19] = bVar20 & 7;
                uVar19 = uVar19 + 1;
              } while (uVar10 != uVar19);
            }
            uVar14 = uVar14 + 1;
            puVar13 = puVar13 + uVar10;
          } while (uVar14 != uVar17);
        }
        if ((uVar9 & 4) != 0) {
          puVar13 = (undefined1 *)calloc(uVar26,1);
          if (uVar26 != 0) {
            uVar14 = 0;
            do {
              puVar13[uVar14] = __ptr[(long)(int)(bVar16 - 1) + (uVar14 % uVar10) * -2 + uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar26 != uVar14);
          }
          free(__ptr);
          __ptr = puVar13;
        }
        if ((uVar9 & 8) != 0) {
          puVar13 = (undefined1 *)calloc(uVar26,1);
          if (uVar26 != 0) {
            uVar14 = 0;
            do {
              puVar13[uVar14] =
                   __ptr[((long)(int)(bVar24 - 1) - uVar14 / uVar10) * uVar10 + uVar14 % uVar10];
              uVar14 = uVar14 + 1;
            } while (uVar26 != uVar14);
          }
          free(__ptr);
          __ptr = puVar13;
        }
        uVar12 = (uint)uVar9 & 3;
        if ((uVar9 & 3) != 0) {
          puVar13 = (undefined1 *)calloc(uVar26,1);
          if (uVar12 == 1) {
            if (uVar25 != 0) {
              uVar14 = 0;
              do {
                puVar13[uVar14] =
                     __ptr[((long)(int)(bVar24 - 1) - uVar14 % uVar17) * uVar10 + uVar14 / uVar17];
                uVar14 = uVar14 + 1;
              } while (uVar26 != uVar14);
            }
          }
          else if (uVar12 == 2) {
            puVar11 = puVar13;
            if (uVar25 != 0) {
              do {
                *puVar11 = __ptr[uVar26 - 1];
                puVar11 = puVar11 + 1;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
          }
          else if (uVar25 != 0) {
            uVar14 = 0;
            do {
              puVar13[uVar14] =
                   __ptr[(uVar14 % uVar17) * uVar10 + ((long)(int)(bVar16 - 1) - uVar14 / uVar17)];
              uVar14 = uVar14 + 1;
            } while (uVar26 != uVar14);
          }
          free(__ptr);
          __ptr = puVar13;
        }
        pdVar5 = (rom->map).meta;
        pdVar6 = (rom->map).warps_from;
        lVar15 = (long)(rom->map).warps_to - (long)pdVar6;
        if (lVar15 != 0) {
          lVar15 = lVar15 * 0x5555555555555556;
          lVar15 = lVar15 + (ulong)(lVar15 == 0);
          puVar18 = &pdVar6->y;
          do {
            if (town == ((dw_warp *)(puVar18 + -2))->map) {
              uVar21 = puVar18[-1];
              if ((uVar9 & 4) != 0) {
                uVar21 = pdVar5[town].width - uVar21;
              }
              uVar23 = *puVar18;
              if ((uVar9 & 8) != 0) {
                uVar23 = pdVar5[town].height - uVar23;
              }
              switch(uVar12) {
              case 0:
                uVar22 = uVar21;
                break;
              case 1:
                uVar22 = pdVar5[town].height - uVar23;
                uVar23 = uVar21;
                break;
              case 2:
                uVar22 = pdVar5[town].width - uVar21;
                uVar23 = pdVar5[town].height - uVar23;
                break;
              case 3:
                uVar22 = uVar23;
                uVar23 = pdVar5[town].width - uVar21;
              }
              puVar18[-1] = uVar22;
              *puVar18 = uVar23;
            }
            puVar18 = puVar18 + 3;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        pdVar7 = rom->chests;
        lVar15 = 0;
        do {
          if (town == pdVar7[lVar15].map) {
            uVar21 = pdVar7[lVar15].x;
            if ((uVar9 & 4) != 0) {
              uVar21 = pdVar5[town].width - uVar21;
            }
            uVar23 = pdVar7[lVar15].y;
            if ((uVar9 & 8) != 0) {
              uVar23 = pdVar5[town].height - uVar23;
            }
            switch(uVar12) {
            case 0:
              uVar22 = uVar21;
              break;
            case 1:
              uVar22 = pdVar5[town].height - uVar23;
              uVar23 = uVar21;
              break;
            case 2:
              uVar22 = pdVar5[town].width - uVar21;
              uVar23 = pdVar5[town].height - uVar23;
              break;
            case 3:
              uVar22 = uVar23;
              uVar23 = pdVar5[town].width - uVar21;
            }
            pdVar7[lVar15].x = uVar22;
            pdVar7[lVar15].y = uVar23;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x1f);
        if (lVar27 == 6) {
          pdVar8 = rom->spike_table;
          uVar21 = pdVar8->x[1];
          if ((uVar9 & 4) != 0) {
            uVar21 = pdVar5[0x15].width - uVar21;
          }
          uVar23 = pdVar8->y[1];
          if ((uVar9 & 8) != 0) {
            uVar23 = pdVar5[0x15].height - uVar23;
          }
          switch(uVar12) {
          case 0:
            uVar22 = uVar21;
            break;
          case 1:
            uVar22 = pdVar5[0x15].height - uVar23;
            uVar23 = uVar21;
            break;
          case 2:
            uVar22 = pdVar5[0x15].width - uVar21;
            uVar23 = pdVar5[0x15].height - uVar23;
            break;
          case 3:
            uVar22 = uVar23;
            uVar23 = pdVar5[0x15].width - uVar21;
          }
          pdVar8->x[1] = uVar22;
          rom->spike_table->y[1] = uVar23;
        }
        bVar16 = pdVar4[town].width;
        if ((uVar9 & 1) != 0) {
          bVar16 = pdVar4[town].height;
          pdVar4[town].height = pdVar4[town].width;
          pdVar4[town].width = bVar16;
        }
        uVar10 = 0;
        do {
          uVar26 = (ulong)bVar16;
          uVar17 = 0;
          do {
            set_dungeon_tile(rom,town,(uint8_t)uVar17,(uint8_t)uVar10,
                             __ptr[uVar17 + (uVar26 + 1) * uVar10]);
            bVar16 = pdVar4[town].width;
            uVar26 = (ulong)bVar16;
            bVar28 = uVar17 < uVar26;
            uVar17 = uVar17 + 1;
          } while (bVar28);
          bVar28 = uVar10 < pdVar4[town].height;
          uVar10 = uVar10 + 1;
        } while (bVar28);
        free(__ptr);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 0xf);
  }
  return;
}

Assistant:

void rotate_dungeons(dw_rom *rom)
{
    size_t i;
    dw_map_index to_rotate[] = {
//         OVERWORLD,
//         CHARLOCK,
//         HAUKSNESS,
//         TANTEGEL,
//         TANTEGEL_THRONE_ROOM,
//         CHARLOCK_THRONE_ROOM,
//         KOL,
//         BRECCONARY,
//         GARINHAM,
//         CANTLIN,
//         RIMULDAR,
//         TANTEGEL_BASEMENT,
//         NORTHERN_SHRINE,
//         SOUTHERN_SHRINE,

        CHARLOCK_CAVE_1,
        CHARLOCK_CAVE_2,
        CHARLOCK_CAVE_3,
        CHARLOCK_CAVE_4,
        CHARLOCK_CAVE_5,
        CHARLOCK_CAVE_6,
        SWAMP_CAVE,
        MOUNTAIN_CAVE,
        MOUNTAIN_CAVE_2,
        GARINS_GRAVE_1,
        GARINS_GRAVE_2,
        GARINS_GRAVE_3,
        GARINS_GRAVE_4,
        ERDRICKS_CAVE,
        ERDRICKS_CAVE_2,
    };

    if (ROTATE_DUNGEONS(rom)) {
        printf("Rotating and mirroring dungeons...\n");

        for (i=0; i < sizeof(to_rotate) / sizeof(dw_map_index); i++) {
            rotate_mirror_map(rom, to_rotate[i]);
        }
    }
}